

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O0

int cuddInitInteract(DdManager *table)

{
  int iVar1;
  DdNode **ppDVar2;
  uint uVar3;
  long *__ptr;
  int *support_00;
  int n;
  int slots;
  DdNodePtr *nodelist;
  DdNode *sentinel;
  DdNode *f;
  int *support;
  long *interact;
  ABC_UINT64_T words;
  int local_20;
  int k;
  int j;
  int i;
  DdManager *table_local;
  
  iVar1 = table->size;
  uVar3 = (iVar1 * (iVar1 + -1) >> 7) + 1;
  __ptr = (long *)malloc((ulong)uVar3 << 3);
  table->interact = __ptr;
  if (__ptr == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    table_local._4_4_ = 0;
  }
  else {
    for (k = 0; (uint)k < uVar3; k = k + 1) {
      __ptr[k] = 0;
    }
    support_00 = (int *)malloc((long)iVar1 << 2);
    if (support_00 == (int *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
      if (__ptr != (long *)0x0) {
        free(__ptr);
      }
      table_local._4_4_ = 0;
    }
    else {
      for (k = 0; k < iVar1; k = k + 1) {
        ppDVar2 = table->subtables[k].nodelist;
        uVar3 = table->subtables[k].slots;
        for (local_20 = 0; local_20 < (int)uVar3; local_20 = local_20 + 1) {
          for (sentinel = ppDVar2[local_20]; (DdManager *)sentinel != table;
              sentinel = (DdNode *)((ulong)sentinel->next & 0xfffffffffffffffe)) {
            if (((ulong)sentinel->next & 1) == 0) {
              for (words._4_4_ = 0; words._4_4_ < iVar1; words._4_4_ = words._4_4_ + 1) {
                support_00[words._4_4_] = 0;
              }
              ddSuppInteract(sentinel,support_00);
              ddClearLocal(sentinel);
              ddUpdateInteract(table,support_00);
            }
          }
        }
      }
      ddClearGlobal(table);
      if (support_00 != (int *)0x0) {
        free(support_00);
      }
      table_local._4_4_ = 1;
    }
  }
  return table_local._4_4_;
}

Assistant:

int
cuddInitInteract(
  DdManager * table)
{
    int i,j,k;
    ABC_UINT64_T words;
    long *interact;
    int *support;
    DdNode *f;
    DdNode *sentinel = &(table->sentinel);
    DdNodePtr *nodelist;
    int slots;
    int n = table->size;

    words = ((n * (n-1)) >> (1 + LOGBPL)) + 1;
    table->interact = interact = ABC_ALLOC(long,(unsigned)words);
    if (interact == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < words; i++) {
        interact[i] = 0;
    }

    support = ABC_ALLOC(int,n);
    if (support == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(interact);
        return(0);
    }

    for (i = 0; i < n; i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            f = nodelist[j];
            while (f != sentinel) {
                /* A node is a root of the DAG if it cannot be
                ** reached by nodes above it. If a node was never
                ** reached during the previous depth-first searches,
                ** then it is a root, and we start a new depth-first
                ** search from it.
                */
                if (!Cudd_IsComplement(f->next)) {
                    for (k = 0; k < n; k++) {
                        support[k] = 0;
                    }
                    ddSuppInteract(f,support);
                    ddClearLocal(f);
                    ddUpdateInteract(table,support);
                }
                f = Cudd_Regular(f->next);
            }
        }
    }
    ddClearGlobal(table);

    ABC_FREE(support);
    return(1);

}